

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

CloudMediumProvider *
pbrt::CloudMediumProvider::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  undefined4 extraout_var;
  undefined1 auVar7 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar12 [60];
  undefined1 auVar11 [64];
  Point3f PVar13;
  Point3f PVar14;
  string local_78;
  Float local_54;
  Float local_50;
  Float local_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  Tuple3<pbrt::Point3,_float> local_28;
  CloudMediumProvider *pCVar6;
  undefined1 auVar10 [56];
  
  auVar12 = in_ZMM1._4_60_;
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"density","");
  local_4c = ParameterDictionary::GetOneFloat(parameters,&local_78,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"wispiness","");
  local_50 = ParameterDictionary::GetOneFloat(parameters,&local_78,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"extent","");
  local_54 = ParameterDictionary::GetOneFloat(parameters,&local_78,1.0);
  auVar10 = extraout_var_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"p0","");
  local_28.x = 0.0;
  local_28.y = 0.0;
  local_28.z = 0.0;
  PVar13 = ParameterDictionary::GetOnePoint3f(parameters,&local_78,(Point3f *)&local_28);
  auVar8._0_8_ = PVar13.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar10;
  local_38 = auVar8._0_16_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"p1","");
  auVar7._8_4_ = 0x3f800000;
  auVar7._0_8_ = 0x3f8000003f800000;
  auVar7._12_4_ = 0x3f800000;
  auVar10 = ZEXT856(auVar7._8_8_);
  local_28._0_8_ = vmovlps_avx(auVar7);
  local_28.z = 1.0;
  PVar14 = ParameterDictionary::GetOnePoint3f(parameters,&local_78,(Point3f *)&local_28);
  auVar11._0_4_ = PVar14.super_Tuple3<pbrt::Point3,_float>.z;
  auVar11._4_60_ = auVar12;
  auVar7 = auVar11._0_16_;
  auVar9._0_8_ = PVar14.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar10;
  local_48 = auVar9._0_16_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    auVar7 = ZEXT416((uint)auVar11._0_4_);
  }
  auVar3 = vminps_avx(local_48,local_38);
  auVar4 = vminss_avx(auVar7,ZEXT416((uint)PVar13.super_Tuple3<pbrt::Point3,_float>.z));
  local_38 = vmaxps_avx(local_48,local_38);
  auVar7 = vmaxss_avx(auVar7,ZEXT416((uint)PVar13.super_Tuple3<pbrt::Point3,_float>.z));
  local_48 = auVar3;
  iVar5 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x24,4);
  pCVar6 = (CloudMediumProvider *)CONCAT44(extraout_var,iVar5);
  uVar2 = vmovlps_avx(local_48);
  (pCVar6->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (pCVar6->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
  (pCVar6->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar4._0_4_;
  uVar2 = vmovlps_avx(local_38);
  (pCVar6->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (pCVar6->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
  (pCVar6->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar7._0_4_;
  pCVar6->density = local_4c;
  pCVar6->wispiness = local_50;
  pCVar6->extent = local_54;
  return pCVar6;
}

Assistant:

CloudMediumProvider *CloudMediumProvider::Create(const ParameterDictionary &parameters,
                                                 const FileLoc *loc, Allocator alloc) {
    Float density = parameters.GetOneFloat("density", 1);
    Float wispiness = parameters.GetOneFloat("wispiness", 1);
    Float extent = parameters.GetOneFloat("extent", 1);

    Point3f p0 = parameters.GetOnePoint3f("p0", Point3f(0.f, 0.f, 0.f));
    Point3f p1 = parameters.GetOnePoint3f("p1", Point3f(1.f, 1.f, 1.f));

    return alloc.new_object<CloudMediumProvider>(Bounds3f(p0, p1), density, wispiness,
                                                 extent);
}